

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O1

void Vertical_Sweep_Span(black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,
                        PProfile_conflict left,PProfile_conflict right)

{
  ushort uVar1;
  PByte puVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  short sVar14;
  long lVar15;
  int iVar16;
  
  lVar15 = (long)worker->precision;
  uVar5 = (lVar15 + x1) - 1U & -lVar15;
  uVar12 = -lVar15 & x2;
  if ((left->flags & 7) != 2) {
    uVar10 = uVar5;
    if (uVar5 == x1) {
      uVar10 = uVar12;
    }
    if (uVar12 == x2) {
      uVar10 = uVar12;
    }
    if (x2 - (lVar15 + x1) <= (long)worker->precision_jitter) {
      uVar12 = uVar10;
    }
  }
  bVar9 = (byte)worker->precision_bits;
  lVar15 = (long)uVar5 >> (bVar9 & 0x3f);
  lVar13 = (long)uVar12 >> (bVar9 & 0x3f);
  if (-1 < lVar13) {
    uVar1 = worker->bWidth;
    if (lVar15 < (long)(ulong)uVar1) {
      uVar7 = 0;
      if (0 < lVar15) {
        uVar7 = (uint)lVar15;
      }
      uVar3 = uVar1 - 1;
      if (lVar13 < (long)(ulong)uVar1) {
        uVar3 = (uint)lVar13;
      }
      sVar14 = (short)(uVar7 >> 3);
      bVar9 = 0xff >> ((byte)uVar7 & 7);
      iVar16 = (int)(short)(uVar3 >> 3);
      bVar11 = -0x80 >> ((byte)uVar3 & 7);
      puVar2 = worker->bLine;
      lVar15 = (long)sVar14;
      pbVar6 = puVar2 + lVar15;
      iVar8 = iVar16 - sVar14;
      if (iVar8 == 0 || iVar16 < sVar14) {
        bVar11 = bVar11 & bVar9;
      }
      else {
        *pbVar6 = *pbVar6 | bVar9;
        if (iVar8 != 1) {
          iVar4 = 2;
          if (iVar8 < 2) {
            iVar4 = iVar8;
          }
          uVar12 = (ulong)(uint)((iVar16 - sVar14) - iVar4);
          memset(puVar2 + lVar15 + 1,0xff,uVar12 + 1);
          pbVar6 = puVar2 + uVar12 + lVar15 + 1;
        }
        pbVar6 = pbVar6 + 1;
      }
      *pbVar6 = *pbVar6 | bVar11;
    }
  }
  return;
}

Assistant:

static void
  Vertical_Sweep_Span( RAS_ARGS Short       y,
                                FT_F26Dot6  x1,
                                FT_F26Dot6  x2,
                                PProfile    left,
                                PProfile    right )
  {
    Long  e1, e2;

    Int  dropOutControl = left->flags & 7;

    FT_UNUSED( y );
    FT_UNUSED( left );
    FT_UNUSED( right );


    /* in high-precision mode, we need 12 digits after the comma to */
    /* represent multiples of 1/(1<<12) = 1/4096                    */
    FT_TRACE7(( "  y=%d x=[% .12f;% .12f]",
                y,
                (double)x1 / (double)ras.precision,
                (double)x2 / (double)ras.precision ));

    /* Drop-out control */

    e1 = CEILING( x1 );
    e2 = FLOOR( x2 );

    /* take care of the special case where both the left */
    /* and right contour lie exactly on pixel centers    */
    if ( dropOutControl != 2                             &&
         x2 - x1 - ras.precision <= ras.precision_jitter &&
         e1 != x1 && e2 != x2                            )
      e2 = e1;

    e1 = TRUNC( e1 );
    e2 = TRUNC( e2 );

    if ( e2 >= 0 && e1 < ras.bWidth )
    {
      Byte*  target;

      Int   c1, c2;
      Byte  f1, f2;


      if ( e1 < 0 )
        e1 = 0;
      if ( e2 >= ras.bWidth )
        e2 = ras.bWidth - 1;

      FT_TRACE7(( " -> x=[%ld;%ld]", e1, e2 ));

      c1 = (Short)( e1 >> 3 );
      c2 = (Short)( e2 >> 3 );

      f1 = (Byte)  ( 0xFF >> ( e1 & 7 ) );
      f2 = (Byte) ~( 0x7F >> ( e2 & 7 ) );

      target = ras.bLine + c1;
      c2 -= c1;

      if ( c2 > 0 )
      {
        target[0] |= f1;

        /* memset() is slower than the following code on many platforms. */
        /* This is due to the fact that, in the vast majority of cases,  */
        /* the span length in bytes is relatively small.                 */
        while ( --c2 > 0 )
          *( ++target ) = 0xFF;

        target[1] |= f2;
      }
      else
        *target |= ( f1 & f2 );
    }

    FT_TRACE7(( "\n" ));
  }